

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

int av1_fast_palette_color_index_context_on_edge
              (uint8_t *color_map,int stride,int r,int c,int *color_idx)

{
  byte bVar1;
  byte bVar2;
  int color_index_ctx;
  uint8_t color_index_ctx_hash;
  uint8_t hash_multiplier;
  uint8_t color_score;
  uint8_t current_color;
  uint8_t color_neighbor;
  _Bool has_above;
  _Bool has_left;
  int *color_idx_local;
  int c_local;
  int r_local;
  int stride_local;
  uint8_t *color_map_local;
  
  if (r + -1 < 0) {
    bVar1 = color_map[r * stride + c + -1];
  }
  else {
    bVar1 = color_map[(r + -1) * stride + c];
  }
  bVar2 = color_map[r * stride + c];
  *color_idx = (uint)bVar2;
  if (bVar2 < bVar1) {
    *color_idx = *color_idx + 1;
  }
  else if (bVar1 == bVar2) {
    *color_idx = 0;
  }
  return 0;
}

Assistant:

static inline int av1_fast_palette_color_index_context_on_edge(
    const uint8_t *color_map, int stride, int r, int c, int *color_idx) {
  const bool has_left = (c - 1 >= 0);
  const bool has_above = (r - 1 >= 0);
  assert(r > 0 || c > 0);
  assert(has_above ^ has_left);
  assert(color_idx);
  (void)has_left;

  const uint8_t color_neighbor = has_above
                                     ? color_map[(r - 1) * stride + (c - 0)]
                                     : color_map[(r - 0) * stride + (c - 1)];
  // If the neighbor color has higher index than current color index, then we
  // move up by 1.
  const uint8_t current_color = *color_idx = color_map[r * stride + c];
  if (color_neighbor > current_color) {
    (*color_idx)++;
  } else if (color_neighbor == current_color) {
    *color_idx = 0;
  }

  // Get hash value of context.
  // The non-diagonal neighbors get a weight of 2.
  const uint8_t color_score = 2;
  const uint8_t hash_multiplier = 1;
  const uint8_t color_index_ctx_hash = color_score * hash_multiplier;

  // Lookup context from hash.
  const int color_index_ctx =
      av1_palette_color_index_context_lookup[color_index_ctx_hash];
  assert(color_index_ctx == 0);
  (void)color_index_ctx;
  return 0;
}